

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall
pbrt::BilinearPatchMesh::BilinearPatchMesh
          (BilinearPatchMesh *this,Transform *renderFromObject,bool reverseOrientation,
          vector<int,_std::allocator<int>_> *indices,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *P,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *N,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> UV,
          vector<int,_std::allocator<int>_> fIndices,PiecewiseConstant2D *imageDist)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  pointer pPVar5;
  pointer pNVar6;
  float fVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  Point3f *p;
  ulong uVar10;
  int *piVar11;
  pointer pPVar12;
  Point3<float> *pPVar13;
  Point2<float> *pPVar14;
  pointer pNVar15;
  Normal3<float> *pNVar16;
  int iVar17;
  ulong uVar18;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *__range1;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int vb;
  size_type va;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *local_38;
  
  this->reverseOrientation = reverseOrientation;
  local_38 = N;
  bVar9 = Transform::SwapsHandedness(renderFromObject);
  this->transformSwapsHandedness = bVar9;
  uVar10 = (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  iVar17 = (int)(uVar10 >> 2);
  this->nPatches = iVar17;
  uVar18 = ((long)(P->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(P->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  va = uVar10 & 3;
  this->nVertices = (int)uVar18;
  this->vertexIndices = (int *)0x0;
  this->p = (Point3f *)0x0;
  this->n = (Normal3f *)0x0;
  this->uv = (Point2f *)0x0;
  this->faceIndices = (int *)0x0;
  this->imageDistribution =
       (PiecewiseConstant2D *)
       UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  vb = 0;
  if (va != 0) {
    LogFatal<char_const(&)[21],char_const(&)[2],char_const(&)[21],unsigned_long&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
               ,0xa9,"Check failed: %s == %s with %s = %s, %s = %s",
               (char (*) [21])"(indices.size() % 4)",(char (*) [2])0x2925374,
               (char (*) [21])"(indices.size() % 4)",&va,(char (*) [2])0x2925374,&vb);
  }
  *(long *)(in_FS_OFFSET + -0x4c0) = *(long *)(in_FS_OFFSET + -0x4c0) + 1;
  vb = 0x7fffffff;
  *(long *)(in_FS_OFFSET + -0x4b8) = *(long *)(in_FS_OFFSET + -0x4b8) + (long)iVar17;
  if ((uVar18 & 0xffffffff80000000) == 0) {
    vb = 0x7fffffff;
    va = uVar10;
    if ((uVar10 & 0xffffffff80000000) != 0) {
      LogFatal<char_const(&)[15],char_const(&)[32],char_const(&)[15],unsigned_long&,char_const(&)[32],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                 ,0xb0,"Check failed: %s <= %s with %s = %s, %s = %s",
                 (char (*) [15])"indices.size()",(char (*) [32])"std::numeric_limits<int>::max()",
                 (char (*) [15])"indices.size()",&va,
                 (char (*) [32])"std::numeric_limits<int>::max()",&vb);
    }
    piVar11 = BufferCache<int>::LookupOrAdd(intBufferCache,indices);
    this->vertexIndices = piVar11;
    *(long *)(in_FS_OFFSET + -0x4b0) = *(long *)(in_FS_OFFSET + -0x4b0) + 0x40;
    pPVar5 = (P->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pPVar12 = (P->
                   super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start; pPVar12 != pPVar5;
        pPVar12 = pPVar12 + 1) {
      fVar1 = (pPVar12->super_Tuple3<pbrt::Point3,_float>).y;
      fVar2 = (pPVar12->super_Tuple3<pbrt::Point3,_float>).x;
      fVar3 = (pPVar12->super_Tuple3<pbrt::Point3,_float>).z;
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->m).m[0][1])),
                                ZEXT416((uint)fVar2),ZEXT416((uint)(renderFromObject->m).m[0][0]));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->m).m[1][1])),
                               ZEXT416((uint)fVar2),ZEXT416((uint)(renderFromObject->m).m[1][0]));
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->m).m[3][1])),
                                ZEXT416((uint)fVar2),ZEXT416((uint)(renderFromObject->m).m[3][0]));
      auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->m).m[2][1])),
                                ZEXT416((uint)fVar2),ZEXT416((uint)(renderFromObject->m).m[2][0]));
      auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar3),
                                ZEXT416((uint)(renderFromObject->m).m[0][2]));
      auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar3),
                               ZEXT416((uint)(renderFromObject->m).m[1][2]));
      auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar3),
                                ZEXT416((uint)(renderFromObject->m).m[3][2]));
      auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar3),
                                ZEXT416((uint)(renderFromObject->m).m[2][2]));
      fVar1 = auVar21._0_4_ + (renderFromObject->m).m[3][3];
      fVar2 = auVar19._0_4_ + (renderFromObject->m).m[0][3];
      fVar3 = auVar8._0_4_ + (renderFromObject->m).m[1][3];
      fVar7 = auVar22._0_4_ + (renderFromObject->m).m[2][3];
      bVar9 = fVar1 == 1.0;
      auVar19 = vinsertps_avx(ZEXT416((uint)bVar9 * (int)fVar2 + (uint)!bVar9 * (int)(fVar2 / fVar1)
                                     ),ZEXT416((uint)bVar9 * (int)fVar3 +
                                               (uint)!bVar9 * (int)(fVar3 / fVar1)),0x10);
      uVar4 = vmovlps_avx(auVar19);
      (pPVar12->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar4;
      (pPVar12->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar4 >> 0x20);
      (pPVar12->super_Tuple3<pbrt::Point3,_float>).z =
           (float)((uint)bVar9 * (int)fVar7 + (uint)!bVar9 * (int)(fVar7 / fVar1));
    }
    pPVar13 = BufferCache<pbrt::Point3<float>_>::LookupOrAdd(point3BufferCache,P);
    this->p = pPVar13;
    if ((UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
         super__Vector_impl_data._M_start)->super_Tuple2<pbrt::Point2,_float> !=
        UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
        super__Vector_impl_data._M_start[1].super_Tuple2<pbrt::Point2,_float>) {
      vb = this->nVertices;
      va = (long)UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[1].super_Tuple2<pbrt::Point2,_float> -
           (long)(UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->super_Tuple2<pbrt::Point2,_float> >> 3;
      if (va != (long)vb) {
        LogFatal<char_const(&)[10],char_const(&)[10],char_const(&)[10],int&,char_const(&)[10],unsigned_long&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                   ,0xbd,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [10])"nVertices",
                   (char (*) [10])"UV.size()",(char (*) [10])"nVertices",&vb,
                   (char (*) [10])"UV.size()",&va);
      }
      pPVar14 = BufferCache<pbrt::Point2<float>_>::LookupOrAdd
                          (point2BufferCache,
                           (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                           UV.
                           super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      this->uv = pPVar14;
    }
    pNVar15 = (local_38->
              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pNVar6 = (local_38->
             super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pNVar15 != pNVar6) {
      vb = this->nVertices;
      va = ((long)pNVar6 - (long)pNVar15 >> 2) * -0x5555555555555555;
      if (va - (long)vb != 0) {
        LogFatal<char_const(&)[10],char_const(&)[9],char_const(&)[10],int&,char_const(&)[9],unsigned_long&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                   ,0xc1,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [10])"nVertices",
                   (char (*) [9])"N.size()",(char (*) [10])"nVertices",&vb,(char (*) [9])"N.size()",
                   &va);
      }
      do {
        fVar1 = (pNVar15->super_Tuple3<pbrt::Normal3,_float>).y;
        uVar4 = *(undefined8 *)(renderFromObject->mInv).m[1];
        fVar2 = (pNVar15->super_Tuple3<pbrt::Normal3,_float>).x;
        auVar24._4_4_ = fVar2;
        auVar24._0_4_ = fVar2;
        auVar24._8_4_ = fVar2;
        auVar24._12_4_ = fVar2;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)(renderFromObject->mInv).m[0];
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(renderFromObject->mInv).m[2];
        auVar19._0_4_ = fVar1 * (float)uVar4;
        auVar19._4_4_ = fVar1 * (float)((ulong)uVar4 >> 0x20);
        auVar19._8_4_ = fVar1 * 0.0;
        auVar19._12_4_ = fVar1 * 0.0;
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->mInv).m[1][2])),auVar24,
                                 ZEXT416((uint)(renderFromObject->mInv).m[0][2]));
        auVar19 = vfmadd231ps_fma(auVar19,auVar24,auVar21);
        fVar1 = (pNVar15->super_Tuple3<pbrt::Normal3,_float>).z;
        auVar22._4_4_ = fVar1;
        auVar22._0_4_ = fVar1;
        auVar22._8_4_ = fVar1;
        auVar22._12_4_ = fVar1;
        auVar8 = vfmadd231ss_fma(auVar8,auVar22,ZEXT416((uint)(renderFromObject->mInv).m[2][2]));
        auVar19 = vfmadd231ps_fma(auVar19,auVar22,auVar23);
        uVar4 = vmovlps_avx(auVar19);
        (pNVar15->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar4;
        (pNVar15->super_Tuple3<pbrt::Normal3,_float>).y = (float)(int)((ulong)uVar4 >> 0x20);
        (pNVar15->super_Tuple3<pbrt::Normal3,_float>).z = auVar8._0_4_;
        if (reverseOrientation) {
          auVar20._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
          auVar20._8_4_ = auVar19._8_4_ ^ 0x80000000;
          auVar20._12_4_ = auVar19._12_4_ ^ 0x80000000;
          uVar4 = vmovlps_avx(auVar20);
          (pNVar15->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar4;
          (pNVar15->super_Tuple3<pbrt::Normal3,_float>).y = (float)(int)((ulong)uVar4 >> 0x20);
          (pNVar15->super_Tuple3<pbrt::Normal3,_float>).z = -auVar8._0_4_;
        }
        pNVar15 = pNVar15 + 1;
      } while (pNVar15 != pNVar6);
      pNVar16 = BufferCache<pbrt::Normal3<float>_>::LookupOrAdd(normal3BufferCache,local_38);
      this->n = pNVar16;
    }
    if ((UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->super_Tuple2<pbrt::Point2,_float> !=
        UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish[1].super_Tuple2<pbrt::Point2,_float>) {
      vb = this->nPatches;
      va = (long)UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish[1].super_Tuple2<pbrt::Point2,_float> -
           (long)(UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->super_Tuple2<pbrt::Point2,_float> >> 2
      ;
      if (va != (long)vb) {
        LogFatal<char_const(&)[9],char_const(&)[16],char_const(&)[9],int&,char_const(&)[16],unsigned_long&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                   ,0xcb,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])"nPatches",
                   (char (*) [16])"fIndices.size()",(char (*) [9])"nPatches",&vb,
                   (char (*) [16])"fIndices.size()",&va);
      }
      piVar11 = BufferCache<int>::LookupOrAdd
                          (intBufferCache,
                           (vector<int,_std::allocator<int>_> *)
                           UV.
                           super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      this->faceIndices = piVar11;
    }
    return;
  }
  va = uVar18;
  LogFatal<char_const(&)[9],char_const(&)[32],char_const(&)[9],unsigned_long&,char_const(&)[32],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
             ,0xaf,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [9])"P.size()",
             (char (*) [32])"std::numeric_limits<int>::max()",(char (*) [9])"P.size()",&va,
             (char (*) [32])"std::numeric_limits<int>::max()",&vb);
}

Assistant:

BilinearPatchMesh::BilinearPatchMesh(const Transform &renderFromObject,
                                     bool reverseOrientation, std::vector<int> indices,
                                     std::vector<Point3f> P, std::vector<Normal3f> N,
                                     std::vector<Point2f> UV, std::vector<int> fIndices,
                                     PiecewiseConstant2D *imageDist)
    : reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject.SwapsHandedness()),
      nPatches(indices.size() / 4),
      nVertices(P.size()),
      imageDistribution(std::move(imageDist)) {
    CHECK_EQ((indices.size() % 4), 0);
    ++nBilinearMeshes;
    nBlps += nPatches;

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(P.size(), std::numeric_limits<int>::max());
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());

    vertexIndices = intBufferCache->LookupOrAdd(indices);

    blpBytes += sizeof(*this);

    // Transform mesh vertices to world space
    for (Point3f &p : P)
        p = renderFromObject(p);
    p = point3BufferCache->LookupOrAdd(P);

    // Copy _UV_ and _N_ vertex data, if present
    if (!UV.empty()) {
        CHECK_EQ(nVertices, UV.size());
        uv = point2BufferCache->LookupOrAdd(UV);
    }
    if (!N.empty()) {
        CHECK_EQ(nVertices, N.size());
        for (Normal3f &n : N) {
            n = renderFromObject(n);
            if (reverseOrientation)
                n = -n;
        }
        n = normal3BufferCache->LookupOrAdd(N);
    }

    if (!fIndices.empty()) {
        CHECK_EQ(nPatches, fIndices.size());
        faceIndices = intBufferCache->LookupOrAdd(fIndices);
    }
}